

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snedecor_f_dist.hpp
# Opt level: O1

result_type_conflict1 __thiscall
trng::snedecor_f_dist<float>::pdf(snedecor_f_dist<float> *this,result_type_conflict1 x)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  
  fVar1 = (float)(this->P).n_;
  fVar8 = (float)(this->P).m_;
  fVar2 = logf(fVar1 / fVar8);
  fVar3 = logf(x);
  fVar9 = fVar1 * 0.5;
  fVar4 = logf((x * fVar1) / fVar8 + 1.0);
  fVar5 = lgammaf(fVar9);
  fVar6 = lgammaf(fVar8 * 0.5);
  fVar7 = lgammaf((fVar8 + fVar1) * 0.5);
  fVar1 = expf(fVar7 + ((((fVar3 * (fVar9 + -1.0) + fVar2 * 0.5 * fVar1) -
                         (fVar9 + fVar8 * 0.5) * fVar4) - fVar5) - fVar6));
  return fVar1;
}

Assistant:

pdf(result_type x) const {
      const result_type n{static_cast<result_type>(P.n())};
      const result_type m{static_cast<result_type>(P.m())};
      // return math::exp(math::ln(n)*result_type(1)/result_type(2)*n +
      // math::ln(m)*result_type(1)/result_type(2)*m -
      // 		       math::ln(m+n*x)*result_type(1)/result_type(2)*(m+n) +
      // 		       math::ln(x)*(result_type(1)/result_type(2)*n-1))/math::Beta(result_type(1)/result_type(2)*n,
      // result_type(1)/result_type(2)*m);
      return math::exp(result_type(1) / result_type(2) * math::ln(n / m) * n +
                       math::ln(x) * (result_type(1) / result_type(2) * n - 1) -
                       math::ln(1 + n * x / m) * (result_type(1) / result_type(2) * n +
                                                  result_type(1) / result_type(2) * m) -
                       math::ln_Gamma(result_type(1) / result_type(2) * n) -
                       math::ln_Gamma(result_type(1) / result_type(2) * m) +
                       math::ln_Gamma(result_type(1) / result_type(2) * (n + m)));
    }